

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.cpp
# Opt level: O3

void * LIRMIA3Thread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  SOCKET SVar11;
  CHRONO chrono_period;
  LIRMIA3 lirmia3;
  char szTemp [256];
  char szSaveFilePath [256];
  timespec local_890;
  int local_87c;
  timespec local_878;
  long local_868;
  long lStack_860;
  long local_858;
  long lStack_850;
  timespec local_848;
  int local_838;
  double local_830;
  double local_828;
  double local_820;
  double local_818;
  long local_810;
  LIRMIA3 local_808;
  char local_238 [256];
  char local_138 [264];
  
  memset(&local_808,0,0x5d0);
  iVar5 = clock_getres(4,&local_848);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_878), iVar5 == 0)) {
    local_838 = 0;
    local_868 = 0;
    lStack_860 = 0;
    local_858 = 0;
    lStack_850 = 0;
  }
  lVar9 = 0x32;
  bVar3 = true;
  local_87c = 0;
LAB_001c57fd:
  iVar5 = (int)lVar9;
  local_810 = lVar9;
  do {
    while( true ) {
      if (local_838 == 0) {
        clock_gettime(4,&local_890);
        local_868 = local_890.tv_sec;
        lStack_860 = local_890.tv_nsec;
        local_890.tv_sec =
             ((local_890.tv_sec + local_858) - local_878.tv_sec) +
             (local_890.tv_nsec + lStack_850) / 1000000000;
        local_890.tv_nsec = (local_890.tv_nsec + lStack_850) % 1000000000 - local_878.tv_nsec;
        if (local_890.tv_nsec < 0) {
          local_890.tv_sec = local_890.tv_sec + ~((ulong)-local_890.tv_nsec / 1000000000);
          local_890.tv_nsec =
               local_890.tv_nsec + 1000000000 +
               ((ulong)-local_890.tv_nsec / 1000000000) * 1000000000;
        }
        local_858 = local_890.tv_sec;
        lStack_850 = local_890.tv_nsec;
      }
      iVar6 = clock_getres(4,&local_848);
      if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_878), iVar6 == 0)) {
        local_838 = 0;
        local_858 = 0;
        lStack_850 = 0;
        local_868 = 0;
        lStack_860 = 0;
      }
      local_890.tv_sec = (long)(iVar5 / 1000);
      local_890.tv_nsec = (long)(((iVar5 * 1000) % 1000000) * 1000);
      nanosleep(&local_890,(timespec *)0x0);
      if (bPauseLIRMIA3 == 0) break;
      if (!bVar3) {
        puts("LIRMIA3 paused.");
        SVar11 = local_808.RS232Port.s;
        switch(local_808.RS232Port.DevType) {
        case 0:
          SVar11 = (int)local_808.RS232Port.hDev;
          goto LAB_001c59e3;
        case 1:
        case 3:
          break;
        case 2:
          shutdown(local_808.RS232Port.s,2);
          close(SVar11);
        case 4:
          SVar11 = local_808.RS232Port.s_srv;
          break;
        default:
          goto switchD_001c59a5_default;
        }
        shutdown(SVar11,2);
LAB_001c59e3:
        iVar6 = close(SVar11);
        pcVar10 = "LIRMIA3 disconnected.";
        if (iVar6 != 0) {
switchD_001c59a5_default:
          pcVar10 = "LIRMIA3 disconnection failed.";
        }
        puts(pcVar10);
      }
      if (bExit != 0) {
LAB_001c5e28:
        bVar2 = true;
        goto LAB_001c5e2b;
      }
      local_890.tv_sec = 0;
      local_890.tv_nsec = 100000000;
      nanosleep(&local_890,(timespec *)0x0);
      bVar3 = true;
    }
    if (bRestartLIRMIA3 == 0) {
      if (bVar3) goto LAB_001c5bbb;
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      local_818 = u1;
      local_820 = u2;
      local_828 = u3;
      local_830 = u4;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      iVar6 = SetThrustersLIRMIA3(&local_808,local_818,local_820,local_828,local_830);
      lVar9 = local_810;
      if (iVar6 == 0) goto LAB_001c5e0d;
      puts("Connection to a LIRMIA3 lost.");
      SVar11 = local_808.RS232Port.s;
      switch(local_808.RS232Port.DevType) {
      case 0:
        SVar11 = (int)local_808.RS232Port.hDev;
        goto LAB_001c5c6a;
      case 1:
      case 3:
        break;
      case 2:
        shutdown(local_808.RS232Port.s,2);
        close(SVar11);
      case 4:
        SVar11 = local_808.RS232Port.s_srv;
        break;
      default:
        goto switchD_001c5b4e_default;
      }
      shutdown(SVar11,2);
LAB_001c5c6a:
      iVar6 = close(SVar11);
      pcVar10 = "LIRMIA3 disconnected.";
      if (iVar6 != 0) {
switchD_001c5b4e_default:
        pcVar10 = "LIRMIA3 disconnection failed.";
      }
      puts(pcVar10);
    }
    else {
      if (!bVar3) {
        puts("Restarting a LIRMIA3.");
        SVar11 = local_808.RS232Port.s;
        switch(local_808.RS232Port.DevType) {
        case 0:
          SVar11 = (int)local_808.RS232Port.hDev;
          goto LAB_001c5b8f;
        case 1:
        case 3:
          break;
        case 2:
          shutdown(local_808.RS232Port.s,2);
          close(SVar11);
        case 4:
          SVar11 = local_808.RS232Port.s_srv;
          break;
        default:
          goto switchD_001c5a7c_default;
        }
        shutdown(SVar11,2);
LAB_001c5b8f:
        iVar6 = close(SVar11);
        pcVar10 = "LIRMIA3 disconnected.";
        if (iVar6 != 0) {
switchD_001c5a7c_default:
          pcVar10 = "LIRMIA3 disconnection failed.";
        }
        puts(pcVar10);
      }
      bRestartLIRMIA3 = 0;
LAB_001c5bbb:
      iVar6 = ConnectLIRMIA3(&local_808,"LIRMIA3.txt");
      if (iVar6 == 0) break;
      local_890.tv_sec = 1;
      local_890.tv_nsec = 0;
      nanosleep(&local_890,(timespec *)0x0);
    }
    local_87c = local_87c + 1;
    if (ExitOnErrorCount <= local_87c && 0 < ExitOnErrorCount) {
      bExit = 1;
      goto LAB_001c5e28;
    }
    bVar3 = true;
    bVar2 = true;
    if (bExit != 0) goto LAB_001c5e2b;
  } while( true );
  lVar9 = (long)local_808.threadperiod;
  local_890.tv_sec = (__time_t)(local_808.threadperiod / 1000);
  local_890.tv_nsec = (long)(((local_808.threadperiod * 1000) % 1000000) * 1000);
  nanosleep(&local_890,(timespec *)0x0);
  if ((FILE *)local_808.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_808.pfSaveFile);
    local_808.pfSaveFile = (FILE *)0x0;
  }
  if (local_808.bSaveRawData != 0) {
    if (local_808.szCfgFilePath[0] == '\0') {
      builtin_strncpy(local_238,"lirmia3",8);
    }
    else {
      sprintf(local_238,"%.127s",local_808.szCfgFilePath);
    }
    sVar7 = strlen(local_238);
    iVar5 = (int)sVar7 + 1;
    uVar8 = sVar7 & 0xffffffff;
    do {
      if ((int)uVar8 < 1) goto LAB_001c5da9;
      uVar1 = uVar8 - 1;
      iVar5 = iVar5 + -1;
      lVar4 = uVar8 + 0x1f;
      uVar8 = uVar1;
    } while (*(char *)((long)local_808.bProportionalPWs + lVar4) != '.');
    if ((uVar1 != 0) && (iVar5 <= (int)sVar7)) {
      memset(local_238 + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
    }
LAB_001c5da9:
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar10 = strtimeex_fns();
    sprintf(local_138,"log/%.127s_%.64s.txt",local_238,pcVar10);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    local_808.pfSaveFile = (FILE *)fopen(local_138,"wb");
    if ((FILE *)local_808.pfSaveFile == (FILE *)0x0) {
      puts("Unable to create LIRMIA3 data file.");
      goto LAB_001c5fbd;
    }
  }
LAB_001c5e0d:
  bVar3 = false;
  if (bExit != 0) goto LAB_001c5fbd;
  goto LAB_001c57fd;
LAB_001c5fbd:
  SetThrustersLIRMIA3(&local_808,0.0,0.0,0.0,0.0);
  local_890.tv_sec = 0;
  local_890.tv_nsec = 50000000;
  bVar2 = false;
  nanosleep(&local_890,(timespec *)0x0);
LAB_001c5e2b:
  if (local_838 == 0) {
    clock_gettime(4,&local_890);
    local_868 = local_890.tv_sec;
    lStack_860 = local_890.tv_nsec;
    local_890.tv_sec =
         ((local_890.tv_sec + local_858) - local_878.tv_sec) +
         (local_890.tv_nsec + lStack_850) / 1000000000;
    local_890.tv_nsec = (local_890.tv_nsec + lStack_850) % 1000000000 - local_878.tv_nsec;
    if (local_890.tv_nsec < 0) {
      local_890.tv_sec = local_890.tv_sec + ~((ulong)-local_890.tv_nsec / 1000000000);
      local_890.tv_nsec =
           local_890.tv_nsec + 1000000000 + ((ulong)-local_890.tv_nsec / 1000000000) * 1000000000;
    }
    local_858 = local_890.tv_sec;
    lStack_850 = local_890.tv_nsec;
  }
  if ((FILE *)local_808.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_808.pfSaveFile);
    local_808.pfSaveFile = (FILE *)0x0;
  }
  if (bVar2) goto LAB_001c5f85;
  switch(local_808.RS232Port.DevType) {
  case 0:
    goto LAB_001c5f65;
  case 1:
  case 3:
    SVar11 = local_808.RS232Port.s;
    break;
  case 2:
    shutdown(local_808.RS232Port.s,2);
    close(local_808.RS232Port.s);
  case 4:
    SVar11 = local_808.RS232Port.s_srv;
    break;
  default:
    goto switchD_001c5f2d_default;
  }
  shutdown(SVar11,2);
  local_808.RS232Port.hDev._0_4_ = SVar11;
LAB_001c5f65:
  iVar5 = close((int)local_808.RS232Port.hDev);
  if (iVar5 == 0) {
    pcVar10 = "LIRMIA3 disconnected.";
  }
  else {
switchD_001c5f2d_default:
    pcVar10 = "LIRMIA3 disconnection failed.";
  }
  puts(pcVar10);
LAB_001c5f85:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE LIRMIA3Thread(void* pParam)
{
	LIRMIA3 lirmia3;
	double thrust1 = 0, thrust2 = 0, thrust3 = 0, thrust4 = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&lirmia3, 0, sizeof(LIRMIA3));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		uSleep(1000*threadperiod);

		if (bPauseLIRMIA3) 
		{
			if (bConnected)
			{
				printf("LIRMIA3 paused.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartLIRMIA3) 
		{
			if (bConnected)
			{
				printf("Restarting a LIRMIA3.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
			bRestartLIRMIA3 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectLIRMIA3(&lirmia3, "LIRMIA3.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = lirmia3.threadperiod;
				uSleep(1000*threadperiod);

				if (lirmia3.pfSaveFile != NULL)
				{
					fclose(lirmia3.pfSaveFile); 
					lirmia3.pfSaveFile = NULL;
				}
				if ((lirmia3.bSaveRawData)&&(lirmia3.pfSaveFile == NULL)) 
				{
					if (strlen(lirmia3.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", lirmia3.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "lirmia3");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					lirmia3.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (lirmia3.pfSaveFile == NULL) 
					{
						printf("Unable to create LIRMIA3 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			EnterCriticalSection(&StateVariablesCS);
			thrust1 = u1;
			thrust2 = u2;
			thrust3 = u3;
			thrust4 = u4;
			LeaveCriticalSection(&StateVariablesCS);
			if (SetThrustersLIRMIA3(&lirmia3, thrust1, thrust2, thrust3, thrust4) != EXIT_SUCCESS)
			{
				printf("Connection to a LIRMIA3 lost.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
		}

		//printf("LIRMIA3Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	// Ensure the thrusters are stopped...
	if (bConnected)
	{
		SetThrustersLIRMIA3(&lirmia3, 0, 0, 0, 0);
		mSleep(50);
	}

	StopChronoQuick(&chrono_period);

	if (lirmia3.pfSaveFile != NULL)
	{
		fclose(lirmia3.pfSaveFile); 
		lirmia3.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectLIRMIA3(&lirmia3);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}